

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O0

void protodec_decode(char *in,int count,demod_state_t *d)

{
  int length_bits;
  int iVar1;
  int correct;
  int bufferlength;
  int i;
  demod_state_t *d_local;
  int count_local;
  char *in_local;
  
  for (correct = 0; correct < count; correct = correct + 1) {
    switch(d->state) {
    case 1:
      if (in[correct] == d->last) {
        d->antallpreamble = 0;
      }
      else {
        d->antallpreamble = d->antallpreamble + 1;
      }
      d->last = in[correct];
      if ((0xe < d->antallpreamble) && (in[correct] == '\0')) {
        d->state = 2;
        d->nskurr = 0;
        d->antallpreamble = 0;
      }
      d->nskurr = d->nskurr + 1;
      break;
    case 2:
      if ((in[correct] == d->last) || (d->nstartsign != 0)) {
        if (in[correct] == '\x01') {
          if (d->nstartsign == 0) {
            d->nstartsign = 3;
            d->last = in[correct];
          }
          else if (d->nstartsign == 5) {
            d->nstartsign = d->nstartsign + 1;
            d->npreamble = 0;
            d->antallpreamble = 0;
            d->state = 3;
          }
          else {
            d->nstartsign = d->nstartsign + 1;
          }
        }
        else if (d->nstartsign == 0) {
          d->nstartsign = 1;
        }
        else {
          protodec_reset(d);
        }
      }
      else {
        d->antallpreamble = d->antallpreamble + 1;
      }
      d->npreamble = d->npreamble + 1;
      break;
    case 3:
      if (d->nstartsign < 7) {
        if (in[correct] == '\0') {
          protodec_reset(d);
        }
      }
      else if (in[correct] == '\0') {
        d->state = 4;
        d->nstartsign = 0;
        d->antallenner = 0;
        memset(d->buffer,0,0x1c2);
        d->bufferpos = 0;
      }
      else {
        protodec_reset(d);
      }
      d->nstartsign = d->nstartsign + 1;
      break;
    case 4:
      if (d->bitstuff == 0) {
        if ((in[correct] == d->last) && (in[correct] == '\x01')) {
          d->antallenner = d->antallenner + 1;
          if (d->antallenner == 4) {
            d->bitstuff = 1;
            d->antallenner = 0;
          }
        }
        else {
          d->antallenner = 0;
        }
        d->buffer[d->bufferpos] = in[correct];
        d->bufferpos = d->bufferpos + 1;
        d->ndata = d->ndata + 1;
        if (0x1c0 < d->bufferpos) {
          protodec_reset(d);
        }
      }
      else if (in[correct] == '\x01') {
        d->state = 5;
        d->ndata = 0;
        d->bitstuff = 0;
      }
      else {
        d->ndata = d->ndata + 1;
        d->last = in[correct];
        d->bitstuff = 0;
      }
      break;
    case 5:
      length_bits = d->bufferpos + -0x16;
      if ((in[correct] == '\0') && (0 < length_bits)) {
        iVar1 = protodec_calculate_crc(length_bits,d);
        if (iVar1 == 0) {
          d->lostframes = d->lostframes + 1;
        }
        else {
          d->receivedframes = d->receivedframes + 1;
          protodec_getdata(length_bits,d);
        }
      }
      else {
        d->lostframes2 = d->lostframes2 + 1;
      }
      protodec_reset(d);
    }
    d->last = in[correct];
  }
  return;
}

Assistant:

void protodec_decode(char *in, int count, struct demod_state_t *d)
{
	int i = 0;
	int bufferlength, correct;
	
	while (i < count) {
		switch (d->state) {
		case ST_DATA:
			if (d->bitstuff) {
				if (in[i] == 1) {
					d->state = ST_STOPSIGN;
					d->ndata = 0;
					d->bitstuff = 0;
				} else {
					d->ndata++;
					d->last = in[i];
					d->bitstuff = 0;
				}
			} else {
				if (in[i] == d->last && in[i] == 1) {
					d->antallenner++;
					if (d->antallenner == 4) {
						d->bitstuff = 1;
						d->antallenner = 0;
					}

				} else
					d->antallenner = 0;

				d->buffer[d->bufferpos] = in[i];
				d->bufferpos++;
				d->ndata++;
				
				if (d->bufferpos >= 449) {
					protodec_reset(d);
				}
			}
			break;

        case ST_SKURR:
			if (in[i] != d->last)
				d->antallpreamble++;
			else
				d->antallpreamble = 0;
			d->last = in[i];
			if (d->antallpreamble > 14 && in[i] == 0) {
				d->state = ST_PREAMBLE;
				d->nskurr = 0;
				d->antallpreamble = 0;
			}
			d->nskurr++;
			break;

        case ST_PREAMBLE:
			if (in[i] != d->last && d->nstartsign == 0) {
				d->antallpreamble++;
			} else {
                if (in[i] == 1)	{
                    if (d->nstartsign == 0) {
						d->nstartsign = 3;
						d->last = in[i];
                    } else if (d->nstartsign == 5) {
						d->nstartsign++;
						d->npreamble = 0;
						d->antallpreamble = 0;
						d->state = ST_STARTSIGN;
					} else {
						d->nstartsign++;
					}

                } else {
					if (d->nstartsign == 0) {
						d->nstartsign = 1;
					} else {
						protodec_reset(d);
					}
				}
			}
			d->npreamble++;
			break;

		case ST_STARTSIGN:
			if (d->nstartsign >= 7) {
				if (in[i] == 0) {
					d->state = ST_DATA;
					d->nstartsign = 0;
					d->antallenner = 0;
					memset(d->buffer, 0, DEMOD_BUFFER_LEN);
					d->bufferpos = 0;
				} else {
					protodec_reset(d);
				}

			} else if (in[i] == 0) {
				protodec_reset(d);
			}
			d->nstartsign++;
			break;

		case ST_STOPSIGN:
			bufferlength = d->bufferpos - 6 - 16;
			if (in[i] == 0 && bufferlength > 0) {
				correct = protodec_calculate_crc(bufferlength, d);
				if (correct) {
					d->receivedframes++;
					protodec_getdata(bufferlength, d);
				} else {
					d->lostframes++;
				}
			} else {
				d->lostframes2++;
			}
			protodec_reset(d);
			break;


		}
		d->last = in[i];
		i++;
	}
}